

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getTimeCode(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  uint uVar1;
  invalid_argument *this;
  undefined8 uVar2;
  ulong uVar3;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  SetAttr *in_RDI;
  string *in_R9;
  TimeCodeAttribute *a;
  value_type *in_stack_ffffffffffffff28;
  vector<SetAttr,_std::allocator<SetAttr>_> *in_stack_ffffffffffffff30;
  TypedAttribute<Imf_3_2::TimeCode> *in_stack_ffffffffffffff40;
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  
  if (in_ESI + -3 < *in_RCX) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Expected a time code");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  operator_new(0x10);
  Imf_3_2::TypedAttribute<Imf_3_2::TimeCode>::TypedAttribute(in_stack_ffffffffffffff40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  SetAttr::SetAttr(in_RDI,in_R9,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                   (Attribute *)in_stack_ffffffffffffff28);
  std::vector<SetAttr,_std::allocator<SetAttr>_>::push_back
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  SetAttr::~SetAttr((SetAttr *)0x1073cf);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  uVar2 = Imf_3_2::TypedAttribute<Imf_3_2::TimeCode>::value();
  uVar3 = strtoul(*(char **)(in_RDX + (long)(*in_RCX + 1) * 8),(char **)0x0,0x10);
  Imf_3_2::TimeCode::setTimeAndFlags(uVar2,uVar3 & 0xffffffff,0);
  uVar1 = Imf_3_2::TypedAttribute<Imf_3_2::TimeCode>::value();
  strtoul(*(char **)(in_RDX + (long)(*in_RCX + 2) * 8),(char **)0x0,0x10);
  Imf_3_2::TimeCode::setUserData(uVar1);
  *in_RCX = *in_RCX + 3;
  return;
}

Assistant:

void
getTimeCode (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs)
{
    if (i > argc - 3)
        throw invalid_argument("Expected a time code");

    TimeCodeAttribute* a = new TimeCodeAttribute;
    attrs.push_back (SetAttr (attrName, part, a));

    a->value ().setTimeAndFlags (strtoul (argv[i + 1], 0, 16));
    a->value ().setUserData (strtoul (argv[i + 2], 0, 16));
    i += 3;
}